

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  undefined1 *puVar2;
  TestError *pTVar3;
  string *psVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  string *psVar8;
  long lVar9;
  bool bVar10;
  long *local_148 [2];
  long local_138 [2];
  SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL> *local_128;
  long local_120;
  string example_struct_end;
  string example_struct_begin;
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  string shader_source;
  
  example_struct_begin._M_dataplus._M_p = (pointer)&example_struct_begin.field_2;
  local_128 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_struct_begin,"struct light {\n","");
  example_struct_end._M_dataplus._M_p = (pointer)&example_struct_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&example_struct_end,"};\n\n","");
  local_120 = 1;
  lVar9 = 7;
  do {
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&shader_source,example_struct_begin._M_dataplus._M_p,
               example_struct_begin._M_dataplus._M_p + example_struct_begin._M_string_length);
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"    float","");
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"[2]","");
    (*(local_128->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[6])(local_148,local_128,local_d8,(string *)local_78,local_120);
    std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_148[0]);
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0],local_c8[0] + 1);
    }
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98," x","");
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"[2]","");
    (*(local_128->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[6])
              (local_148,local_128,(string *)local_98,(string *)local_b8,lVar9);
    std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_148[0]);
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    std::__cxx11::string::append((char *)&shader_source);
    std::__cxx11::string::_M_append
              ((char *)&shader_source,(ulong)example_struct_end._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x645);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    puVar2 = (undefined1 *)&shader_source;
    psVar4 = (string *)empty_string_abi_cxx11_;
    puVar5 = empty_string_abi_cxx11_;
    puVar6 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    psVar8 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar2 = empty_string_abi_cxx11_;
      puVar6 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = default_tc_shader_source_abi_cxx11_;
      psVar4 = (string *)&default_te_shader_source_abi_cxx11_;
      puVar7 = default_geometry_shader_source_abi_cxx11_;
      psVar8 = &shader_source;
      break;
    case VERTEX_SHADER_TYPE:
      puVar5 = default_tc_shader_source_abi_cxx11_;
      puVar6 = (undefined1 *)&shader_source;
      goto LAB_00b50ecb;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar6 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = default_tc_shader_source_abi_cxx11_;
      psVar4 = (string *)&default_te_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&shader_source;
      goto LAB_00b50f0c;
    case TESSELATION_CONTROL_SHADER_TYPE:
      puVar5 = (undefined1 *)&shader_source;
      puVar6 = default_vertex_shader_source_abi_cxx11_;
LAB_00b50ecb:
      psVar4 = (string *)&default_te_shader_source_abi_cxx11_;
LAB_00b50f05:
      puVar7 = default_geometry_shader_source_abi_cxx11_;
LAB_00b50f0c:
      puVar2 = empty_string_abi_cxx11_;
      psVar8 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar6 = default_vertex_shader_source_abi_cxx11_;
      puVar5 = default_tc_shader_source_abi_cxx11_;
      psVar4 = &shader_source;
      goto LAB_00b50f05;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x648);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_128->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[10])(local_128,puVar6,puVar5,psVar4,puVar7,psVar8,puVar2,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
      operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1
                     );
    }
    local_120 = local_120 + 1;
    bVar10 = lVar9 == 0;
    lVar9 = lVar9 + -1;
    if (bVar10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)example_struct_end._M_dataplus._M_p != &example_struct_end.field_2) {
        operator_delete(example_struct_end._M_dataplus._M_p,
                        example_struct_end.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)example_struct_begin._M_dataplus._M_p != &example_struct_begin.field_2) {
        operator_delete(example_struct_begin._M_dataplus._M_p,
                        example_struct_begin.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsTypenameStyle4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct_begin("struct light {\n");
	std::string example_struct_end("};\n\n");

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = example_struct_begin;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";
		shader_source += example_struct_end;
		shader_source += shader_start;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}